

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O2

void Aig_ObjDelete_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int fFreeTop)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  bool bVar5;
  
  bVar5 = fFreeTop == 0;
  while( true ) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                    ,0xeb,"void Aig_ObjDelete_rec(Aig_Man_t *, Aig_Obj_t *, int)");
    }
    iVar2 = Aig_ObjIsConst1(pObj);
    if ((iVar2 != 0) || (uVar3 = (uint)*(undefined8 *)&pObj->field_0x18 & 7, uVar3 == 2)) {
      return;
    }
    if (uVar3 == 3) {
      __assert_fail("!Aig_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                    ,0xee,"void Aig_ObjDelete_rec(Aig_Man_t *, Aig_Obj_t *, int)");
    }
    pAVar4 = pObj->pFanin0;
    pAVar1 = pObj->pFanin1;
    Aig_ObjDisconnect(p,pObj);
    if (!bVar5) {
      Aig_ObjDelete(p,pObj);
    }
    pAVar4 = (Aig_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe);
    if ((pAVar4 != (Aig_Obj_t *)0x0) &&
       ((*(ulong *)&pAVar4->field_0x18 & 0xffffffc0) == 0 &&
        (*(ulong *)&pAVar4->field_0x18 & 7) != 0)) {
      Aig_ObjDelete_rec(p,pAVar4,1);
    }
    pObj = (Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe);
    if (pObj == (Aig_Obj_t *)0x0) break;
    if ((*(ulong *)&pObj->field_0x18 & 7) == 0) {
      return;
    }
    bVar5 = false;
    if ((*(ulong *)&pObj->field_0x18 & 0xffffffc0) != 0) {
      return;
    }
  }
  return;
}

Assistant:

void Aig_ObjDelete_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int fFreeTop )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsConst1(pObj) || Aig_ObjIsCi(pObj) )
        return;
    assert( !Aig_ObjIsCo(pObj) );
    pFanin0 = Aig_ObjFanin0(pObj);
    pFanin1 = Aig_ObjFanin1(pObj);
    Aig_ObjDisconnect( p, pObj );
    if ( fFreeTop )
        Aig_ObjDelete( p, pObj );
    if ( pFanin0 && !Aig_ObjIsNone(pFanin0) && Aig_ObjRefs(pFanin0) == 0 )
        Aig_ObjDelete_rec( p, pFanin0, 1 );
    if ( pFanin1 && !Aig_ObjIsNone(pFanin1) && Aig_ObjRefs(pFanin1) == 0 )
        Aig_ObjDelete_rec( p, pFanin1, 1 );
}